

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_install_snapshot_req(raft_server *this,req_msg *req)

{
  pointer psVar1;
  log_entry *this_00;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  ulong uVar4;
  long *plVar5;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  int iVar8;
  buffer *buf;
  size_t sVar9;
  long lVar10;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  shared_ptr<nuraft::resp_msg> sVar12;
  ptr<resp_msg> pVar13;
  ptr<buffer> done_ctx;
  ptr<snapshot_sync_req> sync_req;
  undefined4 local_58;
  int local_54;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((*(_func_int **)(in_RDX + 8) == req[9].super_msg_base._vptr_msg_base[1]) &&
     (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0)) {
    if (*(int *)&req[8].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (*(int *)&req[8].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar1 != (pointer)0x0) {
          iVar8 = (*(code *)(psVar1->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (1 < iVar8) {
            psVar1 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)&done_ctx,
                       "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
                       ,(ulong)*(uint *)(in_RDX + 0x14));
            (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0xfb,(string *)&done_ctx);
            std::__cxx11::string::~string((string *)&done_ctx);
          }
        }
        plVar5 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
        (**(code **)(*plVar5 + 0x40))(plVar5,0xfffffffffffffff6);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)req[9].super_msg_base._vptr_msg_base[1];
  local_54 = 0x11;
  local_58 = *(undefined4 *)(in_RDX + 0x14);
  sync_req.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  sVar12 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long>
                     ((unsigned_long *)this,(msg_type *)&done_ctx,&local_54,
                      (int *)&req->log_entries_,(unsigned_long *)&local_58);
  _Var11 = sVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if ((((ulong)req[2].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0) &&
     (*(_func_int **)(in_RDX + 8) < req[9].super_msg_base._vptr_msg_base[1])) {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 == (pointer)0x0) goto LAB_0013b10b;
    iVar8 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var11._M_pi = extraout_RDX;
    if (iVar8 < 3) goto LAB_0013b10b;
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              ((string *)&done_ctx,
               "received an install snapshot request (%lu) which has lower term than this server (%lu), decline the request"
               ,*(undefined8 *)(in_RDX + 8),req[9].super_msg_base._vptr_msg_base[1]);
    (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar1,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
      ,"handle_install_snapshot_req",0x111,&done_ctx);
  }
  else {
    if ((*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) &&
       (this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38),
       this_00->value_type_ == snp_sync_req)) {
      buf = log_entry::get_buf(this_00);
      snapshot_sync_req::deserialize((snapshot_sync_req *)&sync_req,buf);
      if (req[2].super_msg_base._vptr_msg_base <
          (_func_int **)
          (((sync_req.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->last_log_idx_) {
        bVar7 = handle_snapshot_sync_req
                          ((raft_server *)req,
                           sync_req.
                           super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (bVar7) {
          p_Var2 = (_func_int *)
                   (sync_req.
                    super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->offset_;
          pp_Var3 = this->_vptr_raft_server;
          if ((((sync_req.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->type_ == raw_binary) {
            sVar9 = buffer::size(((sync_req.
                                   super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->data_).
                                 super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
            pp_Var3[4] = p_Var2 + sVar9;
            *(undefined1 *)(pp_Var3 + 6) = 1;
          }
          else {
            pp_Var3[4] = p_Var2;
            *(undefined1 *)(pp_Var3 + 6) = 1;
            if ((sync_req.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->done_ == true) {
              buffer::alloc((buffer *)&done_ctx,1);
              buffer::pos(done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,0);
              buffer::put(done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,'\0');
              buffer::pos(done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,0);
              pp_Var3 = this->_vptr_raft_server;
              std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_50,
                         &done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
              std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)(pp_Var3 + 7),
                         &local_50);
              p_Var6 = &local_50;
              goto LAB_0013b0f2;
            }
          }
        }
      }
      else {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar1 != (pointer)0x0) {
          iVar8 = (*(code *)(psVar1->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (2 < iVar8) {
            psVar1 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar4 = (((sync_req.
                       super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->snapshot_).
                     super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    last_log_idx_;
            pp_Var3 = req[2].super_msg_base._vptr_msg_base;
            lVar10 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
            msg_if_given_abi_cxx11_
                      ((string *)&done_ctx,
                       "received a snapshot (%lu) that is older than current commit idx (%lu), last log idx %lu"
                       ,uVar4,pp_Var3,lVar10 + -1);
            (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar1,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0x124,&done_ctx);
            std::__cxx11::string::~string((string *)&done_ctx);
          }
        }
        buffer::alloc((buffer *)&done_ctx,1);
        buffer::pos(done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
                   );
        buffer::put(done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    '\0');
        buffer::pos(done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
                   );
        pp_Var3 = this->_vptr_raft_server;
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   &done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)(pp_Var3 + 7),
                   &local_40);
        p_Var6 = &local_40;
LAB_0013b0f2:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var6->_M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&done_ctx.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sync_req.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      _Var11._M_pi = extraout_RDX_02;
      goto LAB_0013b10b;
    }
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 == (pointer)0x0) goto LAB_0013b10b;
    iVar8 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var11._M_pi = extraout_RDX_00;
    if (iVar8 < 3) goto LAB_0013b10b;
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              ((string *)&done_ctx,
               "Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value"
              );
    (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar1,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
      ,"handle_install_snapshot_req",0x119,&done_ctx);
  }
  std::__cxx11::string::~string((string *)&done_ctx);
  _Var11._M_pi = extraout_RDX_01;
LAB_0013b10b:
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_install_snapshot_req(req_msg& req) {
    if (req.get_term() == state_->get_term() && !catching_up_) {
        if (role_ == srv_role::candidate) {
            become_follower();

        } else if (role_ == srv_role::leader) {
            // LCOV_EXCL_START
            p_er( "Receive InstallSnapshotRequest from another leader(%d) "
                  "with same term, there must be a bug, server exits",
                  req.get_src() );
            ctx_->state_mgr_->system_exit
                ( raft_err::N10_leader_receive_InstallSnapshotRequest );
            ::exit(-1);
            return ptr<resp_msg>();
            // LCOV_EXCL_STOP

        } else {
            restart_election_timer();
        }
    }

    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::install_snapshot_response,
                           id_,
                           req.get_src(),
                           log_store_->next_slot() );

    if (!catching_up_ && req.get_term() < state_->get_term()) {
        p_wn("received an install snapshot request (%" PRIu64 ") which has lower term "
             "than this server (%" PRIu64 "), decline the request",
             req.get_term(), state_->get_term());
        return resp;
    }

    std::vector<ptr<log_entry>>& entries(req.log_entries());
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::snp_sync_req ) {
        p_wn("Receive an invalid InstallSnapshotRequest due to "
             "bad log entries or bad log entry value");
        return resp;
    }

    ptr<snapshot_sync_req> sync_req =
        snapshot_sync_req::deserialize(entries[0]->get_buf());
    if (sync_req->get_snapshot().get_last_log_idx() <= quick_commit_index_) {
        p_wn( "received a snapshot (%" PRIu64 ") that is older than "
              "current commit idx (%" PRIu64 "), last log idx %" PRIu64,
              sync_req->get_snapshot().get_last_log_idx(),
              quick_commit_index_.load(),
              log_store_->next_slot() - 1);
        // Put dummy CTX to end the snapshot sync.
        ptr<buffer> done_ctx = buffer::alloc(1);
        done_ctx->pos(0);
        done_ctx->put((byte)0);
        done_ctx->pos(0);
        resp->set_ctx(done_ctx);
        return resp;
    }

    if (handle_snapshot_sync_req(*sync_req)) {
        if (sync_req->get_snapshot().get_type() == snapshot::raw_binary) {
            // LCOV_EXCL_START
            // Raw binary: add received byte to offset.
            resp->accept(sync_req->get_offset() + sync_req->get_data().size());
            // LCOV_EXCL_STOP

        } else {
            // Object type: add one (next object index).
            resp->accept(sync_req->get_offset());
            if (sync_req->is_done()) {
                // TODO: check if there is missing object.
                // Add a context buffer to inform installation is done.
                ptr<buffer> done_ctx = buffer::alloc(1);
                done_ctx->pos(0);
                done_ctx->put((byte)0);
                done_ctx->pos(0);
                resp->set_ctx(done_ctx);
            }
        }
    }

    return resp;
}